

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_leaf(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  LY_ERR LVar6;
  long local_e0;
  lysp_ext_instance *local_c0;
  lysp_ext_instance *local_b0;
  lysp_ext_instance *local_98;
  lysp_ext_instance *local_88;
  long local_68;
  long local_60;
  long *plStack_50;
  LY_ERR ret__;
  char *p__;
  uint64_t __u;
  LY_ERR ret;
  lysc_node_leaf *leaf;
  lysp_node_leaf *leaf_p;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  if (pnode[1].parent == (lysp_node *)0x0) {
LAB_00173bd8:
    __u._4_4_ = lysc_unres_must_add(ctx,node,pnode);
    if (__u._4_4_ == LY_SUCCESS) {
      if (pnode[2].exts != (lysp_ext_instance *)0x0) {
        LVar6 = lydict_insert(ctx->ctx,(char *)pnode[2].exts,0,(char **)&node[1].next);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        node->flags = node->flags | 0x400;
      }
      __u._4_4_ = lys_compile_node_type
                            (ctx,pnode,(lysp_type *)&pnode[1].next,(lysc_node_leaf *)node);
      if (__u._4_4_ == LY_SUCCESS) {
        if (pnode[3].parent != (lysp_node *)0x0) {
          LVar6 = lysc_unres_leaf_dflt_add(ctx,(lysc_node_leaf *)node,(lysp_qname *)(pnode + 3));
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          node->flags = node->flags | 0x200;
        }
        if (((node->flags & 0x200) != 0) && ((node->flags & 0x20) != 0)) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory leaf with a default value."
                 );
          return LY_EVALID;
        }
      }
    }
  }
  else {
    lVar1._0_2_ = node[1].nodetype;
    lVar1._2_2_ = node[1].flags;
    lVar1._4_1_ = node[1].hash[0];
    lVar1._5_1_ = node[1].hash[1];
    lVar1._6_1_ = node[1].hash[2];
    lVar1._7_1_ = node[1].hash[3];
    if (lVar1 == 0) {
      local_68 = 0;
    }
    else {
      lVar2._0_2_ = node[1].nodetype;
      lVar2._2_2_ = node[1].flags;
      lVar2._4_1_ = node[1].hash[0];
      lVar2._5_1_ = node[1].hash[1];
      lVar2._6_1_ = node[1].hash[2];
      lVar2._7_1_ = node[1].hash[3];
      if (lVar2 == 0) {
        local_60 = 0;
      }
      else {
        local_60 = *(long *)(*(long *)(node + 1) + -8);
      }
      local_68 = local_60;
    }
    lVar3._0_2_ = node[1].nodetype;
    lVar3._2_2_ = node[1].flags;
    lVar3._4_1_ = node[1].hash[0];
    lVar3._5_1_ = node[1].hash[1];
    lVar3._6_1_ = node[1].hash[2];
    lVar3._7_1_ = node[1].hash[3];
    if (lVar3 == 0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_98 = (lysp_ext_instance *)0x0;
      }
      else {
        local_98 = pnode[1].parent[-1].exts;
      }
      plStack_50 = (long *)calloc(1,((long)&local_98->name + local_68) * 0x38 + 8);
      if (plStack_50 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_leaf")
        ;
        return LY_EMEM;
      }
    }
    else {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_88 = (lysp_ext_instance *)0x0;
      }
      else {
        local_88 = pnode[1].parent[-1].exts;
      }
      plStack_50 = (long *)realloc((void *)(*(long *)(node + 1) + -8),
                                   ((long)&local_88->name +
                                   *(long *)(*(long *)(node + 1) + -8) + local_68) * 0x38 + 8);
      if (plStack_50 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_leaf")
        ;
        return LY_EMEM;
      }
    }
    *(long **)(node + 1) = plStack_50 + 1;
    lVar4._0_2_ = node[1].nodetype;
    lVar4._2_2_ = node[1].flags;
    lVar4._4_1_ = node[1].hash[0];
    lVar4._5_1_ = node[1].hash[1];
    lVar4._6_1_ = node[1].hash[2];
    lVar4._7_1_ = node[1].hash[3];
    if (lVar4 != 0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_b0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b0 = pnode[1].parent[-1].exts;
      }
      memset((void *)(*(long *)(node + 1) + *plStack_50 * 0x38),0,
             ((long)&local_b0->name + local_68) * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_c0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_c0 = pnode[1].parent[-1].exts;
      }
      if (local_c0 <= p__) goto LAB_00173bd8;
      *(long *)(*(long *)(node + 1) + -8) = *(long *)(*(long *)(node + 1) + -8) + 1;
      lVar5._0_2_ = node[1].nodetype;
      lVar5._2_2_ = node[1].flags;
      lVar5._4_1_ = node[1].hash[0];
      lVar5._5_1_ = node[1].hash[1];
      lVar5._6_1_ = node[1].hash[2];
      lVar5._7_1_ = node[1].hash[3];
      if (lVar5 == 0) {
        local_e0 = 0;
      }
      else {
        local_e0 = *(long *)(*(long *)(node + 1) + -8);
      }
      __u._4_4_ = lys_compile_must(ctx,(lysp_restr *)(pnode[1].parent + (long)p__),
                                   (lysc_must *)(*(long *)(node + 1) + (local_e0 + -1) * 0x38));
      if (__u._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return __u._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_leaf(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_leaf *leaf_p = (struct lysp_node_leaf *)pnode;
    struct lysc_node_leaf *leaf = (struct lysc_node_leaf *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, leaf_p->musts, leaf->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (leaf_p->units) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, leaf_p->units, 0, &leaf->units), done);
        leaf->flags |= LYS_SET_UNITS;
    }

    /* compile type */
    ret = lys_compile_node_type(ctx, pnode, &leaf_p->type, leaf);
    LY_CHECK_GOTO(ret, done);

    /* store/update default value */
    if (leaf_p->dflt.str) {
        LY_CHECK_RET(lysc_unres_leaf_dflt_add(ctx, leaf, &leaf_p->dflt));
        leaf->flags |= LYS_SET_DFLT;
    }

    /* checks */
    if ((leaf->flags & LYS_SET_DFLT) && (leaf->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid mandatory leaf with a default value.");
        return LY_EVALID;
    }

done:
    return ret;
}